

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

bool __thiscall spv::Builder::isConstantOpCode(Builder *this,Op opcode)

{
  Op opcode_local;
  Builder *this_local;
  
  if ((((opcode == OpUndef) || (opcode - OpConstantTrue < 6)) || (opcode - OpSpecConstantTrue < 5))
     || (opcode == OpConstantCompositeReplicateEXT || opcode == OpSpecConstantCompositeReplicateEXT)
     ) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Builder::isConstantOpCode(Op opcode) const
{
    switch (opcode) {
    case OpUndef:
    case OpConstantTrue:
    case OpConstantFalse:
    case OpConstant:
    case OpConstantComposite:
    case OpConstantCompositeReplicateEXT:
    case OpConstantSampler:
    case OpConstantNull:
    case OpSpecConstantTrue:
    case OpSpecConstantFalse:
    case OpSpecConstant:
    case OpSpecConstantComposite:
    case OpSpecConstantCompositeReplicateEXT:
    case OpSpecConstantOp:
        return true;
    default:
        return false;
    }
}